

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall SVGChart::PlotDataContainer::ClearData(PlotDataContainer *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppLVar3;
  pointer ppDVar4;
  pointer ppPVar5;
  PlotDataBase *pPVar6;
  LegendData *this_00;
  DataDrawerBase *pDVar7;
  _Vector_base<int,_std::allocator<int>_> *this_01;
  pointer ppPVar8;
  pointer ppPVar9;
  pointer ppLVar10;
  pointer ppDVar11;
  pointer ppPVar12;
  
  ppPVar8 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar9 = (this->mYDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (this->mLegendDataList).
             super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppDVar11 = (this->mDataDrawerList).
             super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppPVar12 = (this->mPlotDataSelectionList).
             super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    ppPVar1 = (this->mXDataList).
              super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppPVar2 = (this->mYDataList).
              super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppLVar3 = (this->mLegendDataList).
              super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppDVar4 = (this->mDataDrawerList).
              super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppPVar5 = (this->mPlotDataSelectionList).
              super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((((ppPVar8 == ppPVar1) || (ppPVar9 == ppPVar2)) || (ppLVar10 == ppLVar3)) ||
       ((ppDVar11 == ppDVar4 || (ppPVar12 == ppPVar5)))) break;
    pPVar6 = *ppPVar9;
    this_00 = *ppLVar10;
    pDVar7 = *ppDVar11;
    this_01 = (_Vector_base<int,_std::allocator<int>_> *)*ppPVar12;
    if (*ppPVar8 != (PlotDataBase *)0x0) {
      (*(*ppPVar8)->_vptr_PlotDataBase[1])();
    }
    if (pPVar6 != (PlotDataBase *)0x0) {
      (*pPVar6->_vptr_PlotDataBase[1])(pPVar6);
    }
    if (this_00 != (LegendData *)0x0) {
      LegendData::~LegendData(this_00);
    }
    operator_delete(this_00,0xa8);
    if (pDVar7 != (DataDrawerBase *)0x0) {
      (*pDVar7->_vptr_DataDrawerBase[1])(pDVar7);
    }
    if (this_01 != (_Vector_base<int,_std::allocator<int>_> *)0x0) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_01);
    }
    operator_delete(this_01,0x18);
    ppPVar8 = ppPVar8 + 1;
    ppPVar9 = ppPVar9 + 1;
    ppLVar10 = ppLVar10 + 1;
    ppDVar11 = ppDVar11 + 1;
    ppPVar12 = ppPVar12 + 1;
  }
  ppPVar8 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 != ppPVar8) {
    (this->mXDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar8;
  }
  ppPVar8 = (this->mYDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar2 != ppPVar8) {
    (this->mYDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar8;
  }
  ppLVar10 = (this->mLegendDataList).
             super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar3 != ppLVar10) {
    (this->mLegendDataList).
    super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar10;
  }
  ppDVar11 = (this->mDataDrawerList).
             super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppDVar4 != ppDVar11) {
    (this->mDataDrawerList).
    super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppDVar11;
  }
  ppPVar12 = (this->mPlotDataSelectionList).
             super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 != ppPVar12) {
    (this->mPlotDataSelectionList).
    super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar12;
  }
  return;
}

Assistant:

void PlotDataContainer::ClearData () {
      PlotDataList::iterator theXI = mXDataList.begin ();
      PlotDataList::iterator theYI = mYDataList.begin ();
      LegendDataList::iterator theLI = mLegendDataList.begin ();
      DataDrawerList::iterator theDI = mDataDrawerList.begin ();
      PlotDataSelectionList::iterator thePI = mPlotDataSelectionList.begin ();

      for (;theXI!=mXDataList.end () && theYI!=mYDataList.end () && theLI!=mLegendDataList.end () && theDI != mDataDrawerList.end () && thePI != mPlotDataSelectionList.end ();) {
        PlotDataBase *theX = *theXI;
        PlotDataBase *theY = *theYI;
        LegendData *theL = *theLI;
        DataDrawerBase *theD = *theDI;
        PlotDataSelection *theP = *thePI;

        delete theX;
        delete theY;
        delete theL;
        delete theD;
        delete theP;

        theXI++;
        theYI++;
        theLI++;
        theDI++;
        thePI++;
      }
      mXDataList.clear ();
      mYDataList.clear ();
      mLegendDataList.clear ();
      mDataDrawerList.clear ();
      mPlotDataSelectionList.clear ();
    }